

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  mode_t mVar4;
  size_t sVar5;
  ostream *poVar6;
  archive_entry *entry;
  time_t t;
  char *pcVar7;
  size_t size;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  time_t epochTime;
  string source_date_epoch;
  string dest;
  time_t now;
  cmLocaleRAII localeRAII;
  istringstream iss;
  string local_258;
  string *local_238;
  string local_230;
  string local_1f8;
  time_t local_1d8;
  cmLocaleRAII local_1d0;
  wstring local_1b0;
  char *local_190;
  undefined1 *local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170;
  size_t local_168;
  char *local_160;
  undefined1 *local_158;
  ios_base local_138 [264];
  
  local_238 = (string *)&this->Error;
  std::__cxx11::string::_M_replace
            ((ulong)local_238,0,(char *)(this->Error)._M_string_length,0x24b9c7);
  sVar5 = strlen(file);
  if (sVar5 <= skip) {
    return true;
  }
  cmLocaleRAII::cmLocaleRAII(&local_1d0);
  local_1b0._M_string_length = (size_type)"";
  if (prefix != (char *)0x0) {
    local_1b0._M_string_length = (size_type)prefix;
  }
  local_1b0._M_dataplus._M_p = (pointer)strlen((char *)local_1b0._M_string_length);
  local_1b0.field_2._M_allocated_capacity = 0;
  local_1b0.field_2._8_8_ = strlen(file + skip);
  local_188 = (undefined1 *)0x0;
  views._M_len = 2;
  views._M_array = (iterator)&local_1b0;
  local_190 = file + skip;
  cmCatViews(&local_1f8,views);
  if (this->Verbose == true) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_1f8._M_dataplus._M_p,local_1f8._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  }
  entry = archive_entry_new();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,file,(allocator<char> *)&local_258);
  cmsys::Encoding::ToWide(&local_1b0,&local_230);
  archive_entry_copy_sourcepath_w(entry,local_1b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity * 4 + 4);
  }
  paVar1 = &local_230.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,(ulong)(local_230.field_2._M_allocated_capacity + 1))
    ;
  }
  cmsys::Encoding::ToWide(&local_1b0,&local_1f8);
  archive_entry_copy_pathname_w(entry,local_1b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity * 4 + 4);
  }
  iVar3 = archive_read_disk_entry_from_file(this->Disk,entry,-1,(stat *)0x0);
  if (iVar3 == 0) {
    if ((this->MTime)._M_string_length == 0) {
      local_230._M_string_length = 0;
      local_230.field_2._M_allocated_capacity =
           local_230.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_230._M_dataplus._M_p = (pointer)paVar1;
      cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&local_230);
      if (local_230._M_string_length != 0) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_1b0,(string *)&local_230,_S_in);
        std::istream::_M_extract<long>((long *)&local_1b0);
        if ((*(uint *)((long)&local_190 + *(long *)(local_1b0._M_dataplus._M_p + -6)) & 7) == 2) {
          archive_entry_set_mtime(entry,(time_t)local_258._M_dataplus._M_p,0);
          archive_entry_set_atime(entry,(time_t)local_258._M_dataplus._M_p,0);
          archive_entry_set_ctime(entry,(time_t)local_258._M_dataplus._M_p,0);
          archive_entry_set_birthtime(entry,(time_t)local_258._M_dataplus._M_p,0);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
        std::ios_base::~ios_base(local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,
                        (ulong)(local_230.field_2._M_allocated_capacity + 1));
      }
LAB_00120f83:
      if (((this->Uid).IsValueSet == true) && ((this->Gid).IsValueSet == true)) {
        archive_entry_set_uid(entry,(long)(this->Uid).Value);
        archive_entry_set_gid(entry,(long)(this->Gid).Value);
      }
      if (((this->Uname)._M_string_length != 0) && ((this->Gname)._M_string_length != 0)) {
        archive_entry_set_uname(entry,(this->Uname)._M_dataplus._M_p);
        archive_entry_set_gname(entry,(this->Gname)._M_dataplus._M_p);
      }
      if ((this->Permissions).IsValueSet == true) {
        archive_entry_set_perm(entry,(this->Permissions).Value);
      }
      if ((this->PermissionsMask).IsValueSet == true) {
        mVar4 = archive_entry_perm(entry);
        archive_entry_set_perm(entry,mVar4 & (this->PermissionsMask).Value);
      }
      archive_entry_acl_clear(entry);
      archive_entry_xattr_clear(entry);
      archive_entry_set_fflags(entry,0,0);
      iVar3 = std::__cxx11::string::compare((char *)&this->Format);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&this->Format), iVar3 == 0)
         ) {
        archive_entry_sparse_clear(entry);
      }
      iVar3 = archive_write_header(this->Archive,entry);
      if (iVar3 == 0) {
        pcVar7 = archive_entry_symlink(entry);
        bVar2 = true;
        if ((pcVar7 == (char *)0x0) && (size = archive_entry_size(entry), size != 0)) {
          bVar2 = AddData(this,file,size);
        }
        goto LAB_0012112d;
      }
      cm_archive_error_string_abi_cxx11_(&local_258,this->Archive);
      local_1b0._M_dataplus._M_p = (wchar_t *)0x16;
      local_1b0._M_string_length = 0x244520;
      local_1b0.field_2._M_allocated_capacity = 0;
      local_1b0.field_2._8_8_ = local_258._M_string_length;
      local_190 = local_258._M_dataplus._M_p;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_1b0;
      local_188 = (undefined1 *)&local_258;
      cmCatViews(&local_230,views_01);
      goto LAB_001210e9;
    }
    time(&local_1d8);
    t = cm_get_date(local_1d8,(this->MTime)._M_dataplus._M_p);
    if (t != -1) {
      archive_entry_set_mtime(entry,t,0);
      goto LAB_00120f83;
    }
    local_1b0._M_dataplus._M_p = (wchar_t *)0x17;
    local_1b0._M_string_length = 0x244508;
    local_1b0.field_2._M_allocated_capacity = 0;
    local_190 = (this->MTime)._M_dataplus._M_p;
    local_1b0.field_2._8_8_ = (this->MTime)._M_string_length;
    local_188 = (undefined1 *)0x0;
    local_230.field_2._M_allocated_capacity = (long)&local_230.field_2 + 8;
    local_230._M_dataplus._M_p = (pointer)0x0;
    local_230._M_string_length = 1;
    local_230.field_2._M_local_buf[8] = '\'';
    local_180 = 1;
    local_170 = 0;
    views_02._M_len = 3;
    views_02._M_array = (iterator)&local_1b0;
    local_178 = (char *)local_230.field_2._M_allocated_capacity;
    cmCatViews(&local_258,views_02);
    std::__cxx11::string::operator=(local_238,(string *)&local_258);
  }
  else {
    cm_archive_error_string_abi_cxx11_(&local_258,this->Disk);
    local_1b0._M_dataplus._M_p = (wchar_t *)0x1a;
    local_1b0._M_string_length = 0x2444ed;
    local_1b0.field_2._M_allocated_capacity = 0;
    local_1b0.field_2._8_8_ = strlen(file);
    local_188 = (undefined1 *)0x0;
    local_180 = 3;
    local_178 = "\': ";
    local_170 = 0;
    local_168 = local_258._M_string_length;
    local_160 = local_258._M_dataplus._M_p;
    views_00._M_len = 4;
    views_00._M_array = (iterator)&local_1b0;
    local_190 = file;
    local_158 = (undefined1 *)&local_258;
    cmCatViews(&local_230,views_00);
LAB_001210e9:
    std::__cxx11::string::operator=(local_238,(string *)&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,
                      (ulong)(local_230.field_2._M_allocated_capacity + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_0012112d:
  archive_entry_free(entry);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  cmLocaleRAII::~cmLocaleRAII(&local_1d0);
  return bVar2;
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file, size_t skip, const char* prefix)
{
  this->Error = "";
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if (skip >= strlen(file)) {
    return true;
  }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = cmStrCat(prefix ? prefix : "", out);
  if (this->Verbose) {
    std::cout << dest << "\n";
  }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if (archive_read_disk_entry_from_file(this->Disk, e, -1, nullptr) !=
      ARCHIVE_OK) {
    this->Error = cmStrCat("Unable to read from file '", file,
                           "': ", cm_archive_error_string(this->Disk));
    return false;
  }
  if (!this->MTime.empty()) {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1) {
      this->Error = cmStrCat("unable to parse mtime '", this->MTime, '\'');
      return false;
    }
    archive_entry_set_mtime(e, t, 0);
  } else {
    std::string source_date_epoch;
    cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
    if (!source_date_epoch.empty()) {
      std::istringstream iss(source_date_epoch);
      time_t epochTime;
      iss >> epochTime;
      if (iss.eof() && !iss.fail()) {
        // Set all of the file times to the epoch time to handle archive
        // formats that include creation/access time.
        archive_entry_set_mtime(e, epochTime, 0);
        archive_entry_set_atime(e, epochTime, 0);
        archive_entry_set_ctime(e, epochTime, 0);
        archive_entry_set_birthtime(e, epochTime, 0);
      }
    }
  }

  // manages the uid/guid of the entry (if any)
  if (this->Uid.IsSet() && this->Gid.IsSet()) {
    archive_entry_set_uid(e, this->Uid.Get());
    archive_entry_set_gid(e, this->Gid.Get());
  }

  if (!this->Uname.empty() && !this->Gname.empty()) {
    archive_entry_set_uname(e, this->Uname.c_str());
    archive_entry_set_gname(e, this->Gname.c_str());
  }

  // manages the permissions
  if (this->Permissions.IsSet()) {
    archive_entry_set_perm(e, this->Permissions.Get());
  }

  if (this->PermissionsMask.IsSet()) {
    int perm = archive_entry_perm(e);
    archive_entry_set_perm(e, perm & this->PermissionsMask.Get());
  }

  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);

  if (this->Format == "pax" || this->Format == "paxr") {
    // Sparse files are a GNU tar extension.
    // Do not use them in standard tar files.
    archive_entry_sparse_clear(e);
  }

  if (archive_write_header(this->Archive, e) != ARCHIVE_OK) {
    this->Error = cmStrCat("archive_write_header: ",
                           cm_archive_error_string(this->Archive));
    return false;
  }

  // do not copy content of symlink
  if (!archive_entry_symlink(e)) {
    // Content.
    if (size_t size = static_cast<size_t>(archive_entry_size(e))) {
      return this->AddData(file, size);
    }
  }
  return true;
}